

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,BeliefSet *Beliefs,
          ValueFunctionPOMDPDiscrete *V)

{
  pointer pAVar1;
  JointBeliefInterface *pJVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  allocator_type local_49;
  pointer local_48;
  ulong local_40;
  value_type_conflict3 local_38;
  
  local_48 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pAVar1 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)(Beliefs->
                super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(Beliefs->
                super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)
                ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (int)(uVar5 >> 3);
  local_38 = -1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)iVar6,&local_38,&local_49);
  if (iVar6 != 0) {
    local_48 = (pointer)(((long)pAVar1 - (long)local_48 >> 3) * -0x3333333333333333);
    uVar4 = (ulong)local_48 & 0xffffffff;
    local_40 = uVar5 >> 3 & 0xffffffff;
    uVar5 = 0;
    do {
      if ((int)local_48 != 0) {
        lVar7 = 0;
        do {
          pJVar2 = (Beliefs->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar5];
          dVar8 = (double)(**(code **)(*(long *)((long)&pJVar2->field_0x0 +
                                                *(long *)((long)*pJVar2 + -0xb8)) + 0x80))
                                    ((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8),
                                     (long)&(((V->
                                              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->_m_values
                                            ).super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl + lVar7);
          pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pdVar3[uVar5] < dVar8) {
            pdVar3[uVar5] = dVar8;
          }
          lVar7 = lVar7 + 0x28;
        } while (uVar4 * 0x28 != lVar7);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSet &Beliefs,
                                      const ValueFunctionPOMDPDiscrete &V)
{
    int nrInV=V.size();
    int nrB=Beliefs.size();

    vector<double> values(nrB,-DBL_MAX);
    double x;

    for(int b=0;b!=nrB;b++)
        for(int i=0;i!=nrInV;i++)
        {
            // compute inner product of belief with vector
            x=Beliefs[b]->InnerProduct(V[i].GetValues());

            // keep the maximizing value
            if(x>values[b])
                values[b]=x;
        }
    
    return(values);
}